

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O3

void do_cmd_close(command *cmd)

{
  player *p;
  _Bool _Var1;
  wchar_t wVar2;
  loc lVar3;
  square *psVar4;
  wchar_t dir;
  loc grid1;
  wchar_t local_24;
  loc local_20;
  
  wVar2 = cmd_get_arg_direction((command_conflict *)cmd,"direction",&local_24);
  if (local_24 == L'\0' || wVar2 != L'\0') {
    wVar2 = count_feats(&local_20,square_isopendoor,false);
    if (wVar2 == L'\x01') {
      lVar3.x = (player->grid).x;
      lVar3.y = (player->grid).y;
      local_24 = motion_dir(lVar3,local_20);
      cmd_set_arg_direction((command_conflict *)cmd,"direction",local_24);
    }
    else {
      wVar2 = cmd_get_direction((command_conflict *)cmd,"direction",&local_24,false);
      if (wVar2 != L'\0') {
        return;
      }
    }
  }
  lVar3 = (loc)loc_sum(player->grid,(loc_conflict)ddgrid[local_24]);
  _Var1 = do_cmd_close_test(player,lVar3);
  p = player;
  if (_Var1) {
    player->upkeep->energy_use = (uint)z_info->move_energy;
    _Var1 = player_confuse_dir(p,&local_24,false);
    if (_Var1) {
      lVar3 = (loc)loc_sum(player->grid,(loc_conflict)ddgrid[local_24]);
    }
    psVar4 = square(cave,lVar3);
    if (psVar4->mon < 1) {
      do_cmd_close_aux(lVar3);
    }
    else {
      msg("There is a monster in the way!");
      py_attack(player,lVar3);
    }
  }
  disturb(player);
  return;
}

Assistant:

void do_cmd_close(struct command *cmd)
{
	struct loc grid;
	int dir;
	int err;

	bool more = false;

	/* Get arguments */
	err = cmd_get_arg_direction(cmd, "direction", &dir);
	if (err || dir == DIR_UNKNOWN) {
		struct loc grid1;

		/* Count open doors */
		if (count_feats(&grid1, square_isopendoor, false) == 1) {
			dir = motion_dir(player->grid, grid1);
			cmd_set_arg_direction(cmd, "direction", dir);
		} else if (cmd_get_direction(cmd, "direction", &dir, false)) {
			return;
		}
	}

	/* Get location */
	grid = loc_sum(player->grid, ddgrid[dir]);

	/* Verify legality */
	if (!do_cmd_close_test(player, grid)) {
		/* Cancel repeat */
		disturb(player);
		return;
	}

	/* Take a turn */
	player->upkeep->energy_use = z_info->move_energy;

	/* Apply confusion */
	if (player_confuse_dir(player, &dir, false)) {
		/* Get location */
		grid = loc_sum(player->grid, ddgrid[dir]);
	}

	/* Monster - alert, then attack */
	if (square(cave, grid)->mon > 0) {
		msg("There is a monster in the way!");
		py_attack(player, grid);
	} else
		/* Door - close it */
		more = do_cmd_close_aux(grid);

	/* Cancel repeat unless told not to */
	if (!more) disturb(player);
}